

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Int_t * Acec_MapMajOuts2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vRanks)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar1 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar1 << 2);
      goto LAB_006877e8;
    }
  }
  __s = (int *)0x0;
LAB_006877e8:
  iVar3 = vAdds->nSize;
  if (0 < iVar3) {
    iVar5 = 0;
    iVar6 = 0;
    do {
      if (iVar3 <= (int)(iVar5 + 4U)) {
LAB_00687838:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = vAdds->pArray[iVar5 + 4U];
      lVar7 = (long)iVar2;
      if ((lVar7 < 0) || (vRanks->nSize <= iVar2)) goto LAB_00687838;
      if (vRanks->pArray[lVar7] != -1) {
        if (iVar1 <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar7] = iVar6;
      }
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + 6;
    } while (iVar5 < iVar3);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Acec_MapMajOuts2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vRanks )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vRanks, Vec_IntEntry(vAdds, 6*i+4)) != -1 )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), i );
    return vMap;
}